

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

void ggml_threadpool_params_init(ggml_threadpool_params *p,int n_threads)

{
  undefined4 in_ESI;
  void *in_RDI;
  
  *(undefined4 *)((long)in_RDI + 0x200) = in_ESI;
  *(undefined4 *)((long)in_RDI + 0x204) = 0;
  *(undefined4 *)((long)in_RDI + 0x208) = 0x32;
  *(undefined1 *)((long)in_RDI + 0x20c) = 0;
  *(undefined1 *)((long)in_RDI + 0x20d) = 0;
  memset(in_RDI,0,0x200);
  return;
}

Assistant:

void ggml_threadpool_params_init(struct ggml_threadpool_params * p, int n_threads) {
    p->n_threads  = n_threads;
    p->prio       = 0;     // default priority (usually means normal or inherited)
    p->poll       = 50;    // hybrid-polling enabled
    p->strict_cpu = false; // no strict placement (all threads share same cpumask)
    p->paused     = false; // threads are ready to go
    memset(p->cpumask, 0, GGML_MAX_N_THREADS); // all-zero means use the default affinity (usually inherited)
}